

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

void fly(ProgressData *bar,_Bool moved)

{
  int iVar1;
  long lVar2;
  int local_1c4;
  int check;
  int pos;
  char buf [402];
  _Bool moved_local;
  ProgressData *bar_local;
  
  iVar1 = bar->width + -2;
  check._0_1_ = 0xd;
  buf[399] = moved;
  unique0x1000029f = bar;
  memset((void *)((long)&check + 1),0x20,(long)bar->width);
  *(undefined1 *)((long)&check + (long)(stack0xfffffffffffffff0->width + 1)) = 0;
  lVar2 = (long)(stack0xfffffffffffffff0->bar + 1);
  *(undefined4 *)((long)&check + lVar2) = 0x3d4f3d2d;
  buf[lVar2 + -4] = '-';
  *(undefined1 *)
   ((long)&check +
   (long)(sinus[(ulong)stack0xfffffffffffffff0->tick % 200] / (int)(1000000 / (long)iVar1) + 1)) =
       0x23;
  *(undefined1 *)
   ((long)&check +
   (long)(sinus[(ulong)(stack0xfffffffffffffff0->tick + 5) % 200] / (int)(1000000 / (long)iVar1) + 1
         )) = 0x23;
  *(undefined1 *)
   ((long)&check +
   (long)(sinus[(ulong)(stack0xfffffffffffffff0->tick + 10) % 200] / (int)(1000000 / (long)iVar1) +
         1)) = 0x23;
  *(undefined1 *)
   ((long)&check +
   (long)(sinus[(ulong)(stack0xfffffffffffffff0->tick + 0xf) % 200] / (int)(1000000 / (long)iVar1) +
         1)) = 0x23;
  fputs((char *)&check,(FILE *)stack0xfffffffffffffff0->out);
  stack0xfffffffffffffff0->tick = stack0xfffffffffffffff0->tick + 2;
  if (199 < stack0xfffffffffffffff0->tick) {
    stack0xfffffffffffffff0->tick = stack0xfffffffffffffff0->tick - 200;
  }
  if ((buf[399] & 1U) == 0) {
    local_1c4 = 0;
  }
  else {
    local_1c4 = stack0xfffffffffffffff0->barmove;
  }
  stack0xfffffffffffffff0->bar = local_1c4 + stack0xfffffffffffffff0->bar;
  if (stack0xfffffffffffffff0->bar < stack0xfffffffffffffff0->width + -6) {
    if (stack0xfffffffffffffff0->bar < 0) {
      stack0xfffffffffffffff0->barmove = 1;
      stack0xfffffffffffffff0->bar = 0;
    }
  }
  else {
    stack0xfffffffffffffff0->barmove = -1;
    stack0xfffffffffffffff0->bar = stack0xfffffffffffffff0->width + -6;
  }
  return;
}

Assistant:

static void fly(struct ProgressData *bar, bool moved)
{
  char buf[MAX_BARLENGTH + 2];
  int pos;
  int check = bar->width - 2;

  /* bar->width is range checked when assigned */
  DEBUGASSERT(bar->width <= MAX_BARLENGTH);
  buf[0] = '\r';
  memset(&buf[1], ' ', bar->width);
  buf[bar->width + 1] = '\0';

  memcpy(&buf[bar->bar + 1], "-=O=-", 5);

  pos = sinus[bar->tick%200] / (1000000 / check) + 1;
  buf[pos] = '#';
  pos = sinus[(bar->tick + 5)%200] / (1000000 / check) + 1;
  buf[pos] = '#';
  pos = sinus[(bar->tick + 10)%200] / (1000000 / check) + 1;
  buf[pos] = '#';
  pos = sinus[(bar->tick + 15)%200] / (1000000 / check) + 1;
  buf[pos] = '#';

  fputs(buf, bar->out);
  bar->tick += 2;
  if(bar->tick >= 200)
    bar->tick -= 200;

  bar->bar += (moved?bar->barmove:0);
  if(bar->bar >= (bar->width - 6)) {
    bar->barmove = -1;
    bar->bar = bar->width - 6;
  }
  else if(bar->bar < 0) {
    bar->barmove = 1;
    bar->bar = 0;
  }
}